

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixture.cpp
# Opt level: O2

void __thiscall iu_TestFixed2_x_iutest_x_Test2_Test::Body(iu_TestFixed2_x_iutest_x_Test2_Test *this)

{
  int *in_R9;
  AssertionResult iutest_ar;
  iuCodeMessage local_1c0;
  Fixed local_190;
  
  local_190.super_Message.m_stream.super_iu_stringstream._0_4_ = 2;
  iutest::internal::CmpHelperEQ<int,int>
            (&iutest_ar,(internal *)0x20292a,"x",(char *)&local_190,&TestFixed::x,in_R9);
  if (iutest_ar.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/samples/fixture.cpp"
               ,0x43,iutest_ar.m_message._M_dataplus._M_p);
    local_1c0._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,&local_190);
  }
  else {
    std::__cxx11::string::~string((string *)&iutest_ar);
    local_190.super_Message.m_stream.super_iu_stringstream._0_4_ = 2;
    iutest::internal::CmpHelperEQ<int,int>
              (&iutest_ar,(internal *)0x20292a,"x",(char *)&local_190,&TestFixed::x,in_R9);
    if (iutest_ar.m_result == false) {
      memset(&local_190,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_1c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/samples/fixture.cpp"
                 ,0x44,iutest_ar.m_message._M_dataplus._M_p);
      local_1c0._44_4_ = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,&local_190);
      std::__cxx11::string::~string((string *)&local_1c0);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
    }
    std::__cxx11::string::~string((string *)&iutest_ar);
    local_190.super_Message.m_stream.super_iu_stringstream._0_4_ = 2;
    iutest::internal::CmpHelperEQ<int,int>
              (&iutest_ar,(internal *)0x20292a,"x",(char *)&local_190,&TestFixed::x,in_R9);
    if (iutest_ar.m_result != false) goto LAB_001d5c88;
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/samples/fixture.cpp"
               ,0x45,iutest_ar.m_message._M_dataplus._M_p);
    local_1c0._44_4_ = 0xffffffff;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,&local_190);
  }
  std::__cxx11::string::~string((string *)&local_1c0);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_190);
LAB_001d5c88:
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

IUTEST_F(TestFixed2, Test2)
{
    IUTEST_ASSERT_EQ(2, x);
    IUTEST_EXPECT_EQ(2, x);
    IUTEST_INFORM_EQ(2, x);
}